

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall cmFileCopier::InstallSymlink(cmFileCopier *this,char *fromFile,char *toFile)

{
  cmCommand *pcVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  allocator local_1e1;
  string local_1e0;
  string symlinkTarget;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190 [22];
  
  symlinkTarget._M_dataplus._M_p = (pointer)&symlinkTarget.field_2;
  symlinkTarget._M_string_length = 0;
  symlinkTarget.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&e,fromFile,(allocator *)&local_1e0);
  bVar2 = cmsys::SystemTools::ReadSymlink((string *)&e,&symlinkTarget);
  std::__cxx11::string::~string((string *)&e);
  if (bVar2) {
    bVar2 = true;
    if (this->Always == false) {
      _e = (pointer)local_190;
      local_190[0]._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&local_1e0,toFile,&local_1e1);
      bVar3 = cmsys::SystemTools::ReadSymlink(&local_1e0,(string *)&e);
      std::__cxx11::string::~string((string *)&local_1e0);
      bVar2 = true;
      if (bVar3) {
        _Var4 = std::operator==(&symlinkTarget,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&e);
        bVar2 = !_Var4;
      }
      std::__cxx11::string::~string((string *)&e);
    }
    (*this->_vptr_cmFileCopier[4])(this,toFile,2,(ulong)bVar2);
    bVar3 = true;
    if (bVar2 == false) goto LAB_0035dad5;
    std::__cxx11::string::string((string *)&e,toFile,(allocator *)&local_1e0);
    cmsys::SystemTools::RemoveFile((string *)&e);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::string((string *)&e,toFile,(allocator *)&local_1e0);
    bVar2 = cmsys::SystemTools::CreateSymlink(&symlinkTarget,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    if (bVar2) goto LAB_0035dad5;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,this->Name);
    poVar5 = std::operator<<(poVar5," cannot duplicate symlink \"");
    poVar5 = std::operator<<(poVar5,fromFile);
    poVar5 = std::operator<<(poVar5,"\" at \"");
    poVar5 = std::operator<<(poVar5,toFile);
    std::operator<<(poVar5,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar1,&local_1e0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,this->Name);
    poVar5 = std::operator<<(poVar5," cannot read symlink \"");
    poVar5 = std::operator<<(poVar5,fromFile);
    poVar5 = std::operator<<(poVar5,"\" to duplicate at \"");
    poVar5 = std::operator<<(poVar5,toFile);
    std::operator<<(poVar5,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar1,&local_1e0);
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  bVar3 = false;
LAB_0035dad5:
  std::__cxx11::string::~string((string *)&symlinkTarget);
  return bVar3;
}

Assistant:

bool cmFileCopier::InstallSymlink(const char* fromFile, const char* toFile)
{
  // Read the original symlink.
  std::string symlinkTarget;
  if(!cmSystemTools::ReadSymlink(fromFile, symlinkTarget))
    {
    std::ostringstream e;
    e << this->Name << " cannot read symlink \"" << fromFile
      << "\" to duplicate at \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if(!this->Always)
    {
    std::string oldSymlinkTarget;
    if(cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget))
      {
      if(symlinkTarget == oldSymlinkTarget)
        {
        copy = false;
        }
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if(copy)
    {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create the symlink.
    if(!cmSystemTools::CreateSymlink(symlinkTarget, toFile))
      {
      std::ostringstream e;
      e << this->Name <<  " cannot duplicate symlink \"" << fromFile
        << "\" at \"" << toFile << "\".";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  return true;
}